

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O1

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  unsigned_long_long *this_00;
  _Base_ptr __fn;
  mapped_type *pmVar1;
  int __flags;
  _func_int **len;
  MapItem *in_RDX;
  void *__child_stack;
  Up *arrayType;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> *__arg;
  Up elemDt;
  unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> local_60;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_58;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_50;
  _Head_base<0UL,_const_yactfr::StructureType_*,_false> local_48;
  uint local_3c;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_38;
  
  len = in_RDX[1].super_Item._vptr_Item;
  local_58._M_head_impl = *(MapItem **)&in_RDX[1].super_Item.super_ItemMixin<yactfr::ItemKind>;
  __arg = &local_58;
  _tryNonNtStrTypeFromPseudoArrayType<yactfr::StaticLengthStringType,yactfr::internal::PseudoSlArrayType,unsigned_long_long>
            (this,(PseudoSlArrayType *)pseudoDt,(PseudoDt *)in_RDX,(unsigned_long_long *)len);
  __flags = (int)len;
  if ((this->_dt)._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl ==
      (StructureType *)0x0) {
    (this->_dt)._M_t.
    super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
    .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl = (StructureType *)0x0
    ;
    this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
    pmVar1 = std::__detail::
             _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_58);
    *pmVar1 = 0;
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)&local_60,pseudoDt);
    local_58._M_head_impl = in_RDX;
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this_00,&local_58);
    local_3c = *(uint *)((long)&(in_RDX->super_MapItemMixin<yactfr::Item>).
                                super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>_>_>_>_>
                                ._theItems._M_t._M_impl.super__Rb_tree_header + 0x20);
    local_38._M_t.
    super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
    super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
         *(tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> *)
          &in_RDX[1].super_Item.super_ItemMixin<yactfr::ItemKind>;
    __fn = *(_Base_ptr *)
            ((long)&(in_RDX->super_MapItemMixin<yactfr::Item>).
                    super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>_>_>_>_>
                    ._theItems._M_t._M_impl.super__Rb_tree_header + 0x18);
    if (__fn == (_Base_ptr)0x0) {
      local_50._M_head_impl = (MapItem *)0x0;
    }
    else {
      MapItem::clone((MapItem *)&local_58,(__fn *)__fn,__child_stack,__flags,__arg);
      local_50._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = (MapItem *)0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  &local_58);
    }
    local_58._M_head_impl._0_1_ =
         *(undefined1 *)
          &in_RDX[1].super_MapItemMixin<yactfr::Item>.
           super_CompoundItemMixin<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::Item,_std::default_delete<const_yactfr::Item>_>_>_>_>_>
           ._theItems._M_t._M_impl;
    StaticLengthArrayType::
    create<unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,unsigned_long_long,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,bool>
              ((StaticLengthArrayType *)&local_48,&local_3c,&local_60,
               (unsigned_long_long *)&local_38,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_50,(bool *)&local_58);
    (this->_dt)._M_t.
    super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
    .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
         local_48._M_head_impl;
    local_48._M_head_impl = (StructureType *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_50);
    if ((tuple<const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>)
        local_60._M_t.
        super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
        .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl !=
        (_Head_base<0UL,_const_yactfr::StructureType_*,_false>)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
                            .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl + 8
                  ))();
    }
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType(const PseudoDt& pseudoDt)
{
    auto& pseudoArrayType = static_cast<const PseudoSlArrayType&>(pseudoDt);

    if (auto arrayType = this->_tryNonNtStrTypeFromPseudoArrayType<StaticLengthStringType>(pseudoArrayType,
                                                                                           pseudoArrayType.pseudoElemType(),
                                                                                           pseudoArrayType.len())) {
        return arrayType;
    }

    auto elemDt = this->_whileVisitingPseudoDt(pseudoArrayType, [this](auto& pseudoArrayType) {
        return this->_dtFromPseudoDt(pseudoArrayType.pseudoElemType());
    });

    return StaticLengthArrayType::create(pseudoArrayType.minAlign(), std::move(elemDt),
                                         pseudoArrayType.len(),
                                         tryCloneAttrs(pseudoArrayType.attrs()),
                                         pseudoArrayType.hasMetadataStreamUuidRole());
}